

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall util::exception::exception<char_const(&)[28]>(exception *this,char (*args) [28])

{
  char (*in_RDX) [28];
  string local_38;
  char (*local_18) [28];
  char (*args_local) [28];
  exception *this_local;
  
  local_18 = args;
  args_local = (char (*) [28])this;
  make_string<char_const(&)[28]>(&local_38,(util *)args,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}